

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_do_probe(monster *mon)

{
  monster_lore_conflict *lore_00;
  monster_lore_conflict *lore;
  monster *mon_local;
  
  lore_00 = get_lore(mon->race);
  lore_00->all_known = true;
  lore_update(mon->race,lore_00);
  if (player->upkeep->monster_race == mon->race) {
    player->upkeep->redraw = player->upkeep->redraw | 0x100000;
  }
  return;
}

Assistant:

void lore_do_probe(struct monster *mon)
{
	struct monster_lore *lore = get_lore(mon->race);
	
	lore->all_known = true;
	lore_update(mon->race, lore);

	/* Update monster recall window */
	if (player->upkeep->monster_race == mon->race)
		player->upkeep->redraw |= (PR_MONSTER);
}